

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMReader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::DataMatrix::Reader::decode(Barcode *__return_storage_ptr__,Reader *this,BinaryBitmap *image)

{
  uint uVar1;
  BitMatrix *image_00;
  DetectorResults detectorResult;
  DetectorResults local_120;
  DecoderResult local_e0;
  
  image_00 = BinaryBitmap::getBitMatrix(image);
  if (image_00 == (BitMatrix *)0x0) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
  }
  else {
    uVar1 = *(uint *)(this->super_Reader)._opts;
    Detect(&local_120,image_00,(bool)((byte)uVar1 & 1),SUB41((uVar1 & 2) >> 1,0),
           SUB41((uVar1 & 0x10) >> 4,0));
    if (local_120._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_120._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      Decode(&local_e0,&local_120._bits);
      Result::Result(__return_storage_ptr__,&local_e0,&local_120,DataMatrix);
      if (local_e0._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e0._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._error._msg._M_dataplus._M_p != &local_e0._error._msg.field_2) {
        operator_delete(local_e0._error._msg._M_dataplus._M_p,
                        local_e0._error._msg.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._structuredAppend.id._M_dataplus._M_p !=
          &local_e0._structuredAppend.id.field_2) {
        operator_delete(local_e0._structuredAppend.id._M_dataplus._M_p,
                        local_e0._structuredAppend.id.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._ecLevel._M_dataplus._M_p != &local_e0._ecLevel.field_2) {
        operator_delete(local_e0._ecLevel._M_dataplus._M_p,
                        local_e0._ecLevel.field_2._M_allocated_capacity + 1);
      }
      if (local_e0._content.encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0._content.encodings.
                        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e0._content.encodings.
                              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0._content.encodings.
                              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0._content.bytes.
                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_120._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120._bits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_120._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode Reader::decode(const BinaryBitmap& image) const
{
#ifdef __cpp_impl_coroutine
	return FirstOrDefault(decode(image, 1));
#else
	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};
	
	auto detectorResult = Detect(*binImg, _opts.tryHarder(), _opts.tryRotate(), _opts.isPure());
	if (!detectorResult.isValid())
		return {};

	return Barcode(Decode(detectorResult.bits()), std::move(detectorResult), BarcodeFormat::DataMatrix);
#endif
}